

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

void __thiscall
BiquadFilter::SetupHighShelf(BiquadFilter *this,float cutoff,float samplerate,float gain,float Q)

{
  float fVar1;
  float __x;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float inv_a0;
  float a0;
  float alpha;
  float A;
  float w0;
  float Q_local;
  float gain_local;
  float samplerate_local;
  float cutoff_local;
  BiquadFilter *this_local;
  
  fVar1 = (cutoff * 6.2831855) / samplerate;
  __x = powf(10.0,gain * 0.025);
  fVar2 = sinf(fVar1);
  fVar2 = fVar2 / (Q * 2.0);
  fVar3 = cosf(fVar1);
  fVar4 = sqrtf(__x);
  this->b0 = __x * (fVar4 * 2.0 * fVar2 + (__x - 1.0) * fVar3 + __x + 1.0);
  fVar3 = cosf(fVar1);
  this->b1 = __x * -2.0 * ((__x + 1.0) * fVar3 + (__x - 1.0));
  fVar3 = cosf(fVar1);
  fVar4 = sqrtf(__x);
  this->b2 = __x * (-(fVar4 * 2.0) * fVar2 + (__x - 1.0) * fVar3 + __x + 1.0);
  fVar3 = cosf(fVar1);
  fVar4 = sqrtf(__x);
  fVar5 = cosf(fVar1);
  this->a1 = (-(__x + 1.0) * fVar5 + (__x - 1.0)) * 2.0;
  fVar1 = cosf(fVar1);
  fVar5 = sqrtf(__x);
  this->a2 = -(fVar5 * 2.0) * fVar2 + -(__x - 1.0) * fVar1 + __x + 1.0;
  fVar1 = 1.0 / (fVar4 * 2.0 * fVar2 + -(__x - 1.0) * fVar3 + __x + 1.0);
  this->a1 = fVar1 * this->a1;
  this->a2 = fVar1 * this->a2;
  this->b0 = fVar1 * this->b0;
  this->b1 = fVar1 * this->b1;
  this->b2 = fVar1 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupHighShelf(float cutoff, float samplerate, float gain, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, A = powf(10.0f, gain * 0.025f), alpha = sinf(w0) / (2.0f * Q), a0;
    b0 =          A * ((A + 1.0f) + (A - 1.0f) * cosf(w0) + 2.0f * sqrtf(A) * alpha);
    b1 =  -2.0f * A * ((A - 1.0f) + (A + 1.0f) * cosf(w0));
    b2 =          A * ((A + 1.0f) + (A - 1.0f) * cosf(w0) - 2.0f * sqrtf(A) * alpha);
    a0 =               (A + 1.0f) - (A - 1.0f) * cosf(w0) + 2.0f * sqrtf(A) * alpha;
    a1 =   2.0f     * ((A - 1.0f) - (A + 1.0f) * cosf(w0));
    a2 =               (A + 1.0f) - (A - 1.0f) * cosf(w0) - 2.0f * sqrtf(A) * alpha;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}